

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

Gia_Man_t *
Gia_ManFindExact(word *pTruth,int nVars,int nFunc,int nMaxDepth,int *pArrTimeProfile,int nBTLimit,
                int nStartGates,int fVerbose)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Ses_Man_t *pSes;
  char *__ptr;
  Gia_Man_t *p;
  char *pcVar7;
  Vec_Int_t *p_00;
  int *piVar8;
  Vec_Ptr_t *vNames;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  Gia_Obj_t *pGVar11;
  Gia_Obj_t *pGVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  byte *pbVar21;
  int iVar22;
  long local_58;
  timespec ts;
  
  if (6 < nVars - 2U) {
    __assert_fail("nVars >= 2 && nVars <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0x99a,"Gia_Man_t *Gia_ManFindExact(word *, int, int, int, int *, int, int, int)")
    ;
  }
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    local_58 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_58 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  pSes = Ses_ManAlloc(pTruth,nVars,nFunc,nMaxDepth,pArrTimeProfile,1,nBTLimit,fVerbose);
  pSes->nStartGates = nStartGates;
  pSes->fVeryVerbose = 1;
  pSes->fExtractVerbose = 0;
  pSes->fSatVerbose = 0;
  pSes->fReasonVerbose = 1;
  if (fVerbose != 0) {
    Ses_ManPrintFuncs(pSes);
  }
  __ptr = Ses_ManFindMinimumSize(pSes);
  piVar8 = (int *)0x0;
  if (__ptr == (char *)0x0) {
    p = (Gia_Man_t *)0x0;
  }
  else {
    p = Gia_ManStart((int)__ptr[1] + (int)__ptr[2] + (int)*__ptr + 1);
    p->nConstrs = 0;
    pcVar7 = Extra_UtilStrsav("exact");
    p->pName = pcVar7;
    iVar22 = (int)*__ptr;
    cVar1 = __ptr[2];
    p_00 = (Vec_Int_t *)malloc(0x10);
    iVar5 = 0x10;
    if (0xe < (cVar1 + iVar22) - 1U) {
      iVar5 = cVar1 + iVar22;
    }
    p_00->nSize = 0;
    p_00->nCap = iVar5;
    if (iVar5 != 0) {
      piVar8 = (int *)malloc((long)iVar5 << 2);
    }
    p_00->pArray = piVar8;
    vNames = Abc_NodeGetFakeNames(__ptr[1] + iVar22);
    iVar22 = (int)*__ptr;
    pVVar9 = (Vec_Ptr_t *)malloc(0x10);
    iVar5 = 8;
    if (6 < iVar22 - 1U) {
      iVar5 = iVar22;
    }
    pVVar9->nCap = iVar5;
    if (iVar5 == 0) {
      ppvVar10 = (void **)0x0;
    }
    else {
      ppvVar10 = (void **)malloc((long)iVar5 << 3);
    }
    pVVar9->pArray = ppvVar10;
    pVVar9->nSize = iVar22;
    memset(ppvVar10,0,(long)iVar22 << 3);
    p->vNamesIn = pVVar9;
    if ('\0' < *__ptr) {
      lVar15 = 0;
      do {
        pGVar11 = Gia_ManAppendObj(p);
        uVar20 = *(ulong *)pGVar11;
        *(ulong *)pGVar11 = uVar20 | 0x9fffffff;
        *(ulong *)pGVar11 =
             uVar20 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20
        ;
        pGVar12 = p->pObjs;
        if ((pGVar11 < pGVar12) || (pGVar12 + p->nObjs <= pGVar11)) goto LAB_002be451;
        Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar12) >> 2) * -0x55555555);
        pGVar12 = p->pObjs;
        if ((pGVar11 < pGVar12) || (pGVar12 + p->nObjs <= pGVar11)) goto LAB_002be451;
        Vec_IntPush(p_00,(int)((ulong)((long)pGVar11 - (long)pGVar12) >> 2) * 0x55555556);
        if (vNames->nSize <= lVar15) goto LAB_002be48f;
        pVVar9 = p->vNamesIn;
        pcVar7 = Extra_UtilStrsav((char *)vNames->pArray[lVar15]);
        Vec_PtrSetEntry(pVVar9,(int)lVar15,pcVar7);
        lVar15 = lVar15 + 1;
      } while (lVar15 < *__ptr);
    }
    pbVar21 = (byte *)(__ptr + 3);
    if ('\0' < __ptr[2]) {
      iVar5 = 0;
      do {
        if (pbVar21[1] != 2) {
          __assert_fail("p[1] == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                        ,0x73f,"Gia_Man_t *Ses_ManExtractGia(const char *)");
        }
        bVar2 = pbVar21[2];
        if (((((char)bVar2 < '\0') || (p_00->nSize <= (int)(char)bVar2)) ||
            (bVar3 = pbVar21[3], (char)bVar3 < '\0')) ||
           ((uint)p_00->nSize <= (uint)(int)(char)bVar3)) goto LAB_002be470;
        uVar16 = p_00->pArray[(uint)(int)(char)bVar2];
        uVar19 = p_00->pArray[(uint)(int)(char)bVar3];
        bVar2 = *pbVar21;
        if ((bVar2 & 1) != 0) {
          if ((int)uVar16 < 0) goto LAB_002be4ec;
          uVar16 = uVar16 ^ 1;
        }
        if ((bVar2 & 2) != 0) {
          if ((int)uVar19 < 0) goto LAB_002be4ec;
          uVar19 = uVar19 ^ 1;
        }
        pGVar12 = Gia_ManAppendObj(p);
        if ((int)uVar16 < 0) {
LAB_002be4cd:
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        uVar13 = uVar16 >> 1;
        uVar4 = p->nObjs;
        if ((int)uVar4 <= (int)uVar13) goto LAB_002be4cd;
        if (((int)uVar19 < 0) || (uVar6 = uVar19 >> 1, uVar4 <= uVar6)) {
          __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        if ((uVar13 == uVar6) && (p->fGiaSimple == 0)) {
          __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x2ab,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        pGVar11 = p->pObjs;
        iVar22 = (int)pGVar12;
        if (uVar16 < uVar19) {
          if (pGVar11 + uVar4 <= pGVar12 || pGVar12 < pGVar11) goto LAB_002be451;
          uVar20 = *(ulong *)pGVar12;
          uVar14 = (ulong)((uVar16 & 1) << 0x1d |
                          ((uint)(iVar22 - (int)pGVar11) >> 2) * -0x55555555 - uVar13 & 0x1fffffff);
          *(ulong *)pGVar12 = uVar14 | uVar20 & 0xffffffffc0000000;
          pGVar11 = p->pObjs;
          if ((pGVar12 < pGVar11) || (pGVar11 + p->nObjs <= pGVar12)) goto LAB_002be451;
          uVar20 = (ulong)(uVar19 & 1) << 0x3d |
                   (ulong)(((uint)(iVar22 - (int)pGVar11) >> 2) * -0x55555555 - uVar6 & 0x1fffffff)
                   << 0x20 | uVar14 | uVar20 & 0xc0000000c0000000;
        }
        else {
          if (pGVar11 + uVar4 <= pGVar12 || pGVar12 < pGVar11) goto LAB_002be451;
          uVar14 = (ulong)(((uint)(iVar22 - (int)pGVar11) >> 2) * -0x55555555 - uVar13 & 0x1fffffff)
                   << 0x20;
          uVar20 = *(ulong *)pGVar12;
          uVar17 = (ulong)(uVar16 & 1) << 0x3d;
          *(ulong *)pGVar12 = uVar17 | uVar20 & 0xc0000000ffffffff | uVar14;
          pGVar11 = p->pObjs;
          if ((pGVar12 < pGVar11) || (pGVar11 + p->nObjs <= pGVar12)) goto LAB_002be451;
          uVar20 = (ulong)((uVar19 & 1) << 0x1d) | uVar17 | uVar20 & 0xc0000000c0000000 | uVar14 |
                   (ulong)(((uint)(iVar22 - (int)pGVar11) >> 2) * -0x55555555 - uVar6 & 0x1fffffff);
        }
        *(ulong *)pGVar12 = uVar20;
        if (p->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p,pGVar12 + -(uVar20 & 0x1fffffff),pGVar12);
          Gia_ObjAddFanout(p,pGVar12 + -((ulong)*(uint *)&pGVar12->field_0x4 & 0x1fffffff),pGVar12);
        }
        if (p->fSweeper != 0) {
          uVar14 = *(ulong *)pGVar12 & 0x1fffffff;
          uVar20 = *(ulong *)pGVar12 >> 0x20 & 0x1fffffff;
          uVar17 = 0x4000000000000000;
          if (((uint)*(ulong *)(pGVar12 + -uVar14) >> 0x1e & 1) == 0) {
            uVar17 = 0x40000000;
          }
          *(ulong *)(pGVar12 + -uVar14) = uVar17 | *(ulong *)(pGVar12 + -uVar14);
          uVar17 = *(ulong *)(pGVar12 + -uVar20);
          uVar18 = 0x4000000000000000;
          if (((uint)uVar17 >> 0x1e & 1) == 0) {
            uVar18 = 0x40000000;
          }
          *(ulong *)(pGVar12 + -uVar20) = uVar18 | uVar17;
          uVar20 = *(ulong *)pGVar12;
          *(ulong *)pGVar12 =
               uVar20 & 0x7fffffffffffffff |
               (ulong)(((uint)(uVar20 >> 0x3d) ^ (uint)(uVar17 >> 0x3f)) &
                      ((uint)((ulong)*(undefined8 *)(pGVar12 + -uVar14) >> 0x3f) ^
                      (uint)(uVar20 >> 0x1d) & 7)) << 0x3f;
        }
        if (p->fBuiltInSim != 0) {
          uVar20 = *(ulong *)pGVar12;
          *(ulong *)pGVar12 =
               uVar20 & 0x7fffffffffffffff |
               (ulong)(((uint)(uVar20 >> 0x3d) ^
                       (uint)((ulong)*(undefined8 *)(pGVar12 + -(uVar20 >> 0x20 & 0x1fffffff)) >>
                             0x3f)) &
                      ((uint)((ulong)*(undefined8 *)(pGVar12 + -(uVar20 & 0x1fffffff)) >> 0x3f) ^
                      (uint)(uVar20 >> 0x1d) & 7)) << 0x3f;
          pGVar11 = p->pObjs;
          if ((pGVar12 < pGVar11) || (pGVar11 + p->nObjs <= pGVar12)) goto LAB_002be451;
          Gia_ManBuiltInSimPerform
                    (p,(int)((ulong)((long)pGVar12 - (long)pGVar11) >> 2) * -0x55555555);
        }
        if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
          Gia_ManQuantSetSuppAnd(p,pGVar12);
        }
        pGVar11 = p->pObjs;
        if ((pGVar12 < pGVar11) || (pGVar11 + p->nObjs <= pGVar12)) goto LAB_002be451;
        uVar16 = (int)((ulong)((long)pGVar12 - (long)pGVar11) >> 2) * 0x55555556;
        if ((~bVar2 & 3) == 0) {
          if ((*pbVar21 & 4) == 0) {
            __assert_fail("( *p >> 2 ) & 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                          ,0x751,"Gia_Man_t *Ses_ManExtractGia(const char *)");
          }
          if ((int)uVar16 < 0) goto LAB_002be4ec;
          uVar16 = uVar16 | 1;
        }
        Vec_IntPush(p_00,uVar16);
        pbVar21 = pbVar21 + 4;
        iVar5 = iVar5 + 1;
      } while (iVar5 < __ptr[2]);
    }
    iVar22 = (int)__ptr[1];
    pVVar9 = (Vec_Ptr_t *)malloc(0x10);
    iVar5 = 8;
    if (6 < iVar22 - 1U) {
      iVar5 = iVar22;
    }
    pVVar9->nCap = iVar5;
    if (iVar5 == 0) {
      ppvVar10 = (void **)0x0;
    }
    else {
      ppvVar10 = (void **)malloc((long)iVar5 << 3);
    }
    pVVar9->pArray = ppvVar10;
    pVVar9->nSize = iVar22;
    iVar5 = 0;
    memset(ppvVar10,0,(long)iVar22 << 3);
    p->vNamesOut = pVVar9;
    if ('\0' < __ptr[1]) {
      do {
        bVar2 = *pbVar21;
        if ((char)bVar2 < '\0') {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar16 = ((uint)(int)(char)bVar2 >> 1) + (int)*__ptr;
        if (((int)uVar16 < 0) || (p_00->nSize <= (int)uVar16)) {
LAB_002be470:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar16 = p_00->pArray[uVar16];
        if (((int)(char)bVar2 & 1U) == 0) {
          if ((int)uVar16 < 0) goto LAB_002be50b;
        }
        else {
          if ((int)uVar16 < 0) {
LAB_002be4ec:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          uVar16 = uVar16 ^ 1;
        }
        uVar19 = uVar16 >> 1;
        if (p->nObjs <= (int)uVar19) {
LAB_002be50b:
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(p->pObjs + uVar19) & 0x1fffffff) != 0 &&
            (int)*(uint *)(p->pObjs + uVar19) < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pGVar11 = Gia_ManAppendObj(p);
        uVar20 = *(ulong *)pGVar11;
        *(ulong *)pGVar11 = uVar20 | 0x80000000;
        pGVar12 = p->pObjs;
        if ((pGVar11 < pGVar12) || (pGVar12 + p->nObjs <= pGVar11)) {
LAB_002be451:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar14 = (ulong)(((uint)((int)pGVar11 - (int)pGVar12) >> 2) * -0x55555555 - uVar19 &
                        0x1fffffff);
        uVar17 = (ulong)((uVar16 & 1) << 0x1d);
        *(ulong *)pGVar11 = uVar17 | uVar20 & 0xffffffffc0000000 | 0x80000000 | uVar14;
        *(ulong *)pGVar11 =
             uVar17 | uVar20 & 0xe0000000c0000000 | 0x80000000 | uVar14 |
             (ulong)(p->vCos->nSize & 0x1fffffff) << 0x20;
        pGVar12 = p->pObjs;
        if ((pGVar11 < pGVar12) || (pGVar12 + p->nObjs <= pGVar11)) goto LAB_002be451;
        Vec_IntPush(p->vCos,(int)((ulong)((long)pGVar11 - (long)pGVar12) >> 2) * -0x55555555);
        if (p->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p,pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff),pGVar11);
        }
        if ((pGVar11 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar11)) goto LAB_002be451;
        uVar16 = *__ptr + iVar5;
        if (((int)uVar16 < 0) || (vNames->nSize <= (int)uVar16)) {
LAB_002be48f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pVVar9 = p->vNamesOut;
        pcVar7 = Extra_UtilStrsav((char *)vNames->pArray[uVar16]);
        Vec_PtrSetEntry(pVVar9,iVar5,pcVar7);
        pbVar21 = pbVar21 + (long)*__ptr + 2;
        iVar5 = iVar5 + 1;
      } while (iVar5 < __ptr[1]);
    }
    Abc_NodeFreeNames(vNames);
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
    }
    free(p_00);
    free(__ptr);
  }
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    lVar15 = -1;
  }
  else {
    lVar15 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  pSes->timeTotal = lVar15 + local_58;
  if (fVerbose != 0) {
    Ses_ManPrintRuntime(pSes);
  }
  if (pSes->pSat != (sat_solver *)0x0) {
    sat_solver_delete(pSes->pSat);
  }
  Ses_ManCleanLight(pSes);
  return p;
}

Assistant:

Gia_Man_t * Gia_ManFindExact( word * pTruth, int nVars, int nFunc, int nMaxDepth, int * pArrTimeProfile, int nBTLimit, int nStartGates, int fVerbose )
{
    Ses_Man_t * pSes;
    char * pSol;
    Gia_Man_t * pGia = NULL;
    abctime timeStart;

    /* some checks */
    assert( nVars >= 2 && nVars <= 8 );

    timeStart = Abc_Clock();

    pSes = Ses_ManAlloc( pTruth, nVars, nFunc, nMaxDepth, pArrTimeProfile, 1, nBTLimit, fVerbose );
    pSes->nStartGates = nStartGates;
    pSes->fVeryVerbose = 1;
    pSes->fExtractVerbose = 0;
    pSes->fSatVerbose = 0;
    pSes->fReasonVerbose = 1;
    if ( fVerbose )
        Ses_ManPrintFuncs( pSes );

    if ( ( pSol = Ses_ManFindMinimumSize( pSes ) ) != NULL )
    {
        pGia = Ses_ManExtractGia( pSol );
        ABC_FREE( pSol );
    }

    pSes->timeTotal = Abc_Clock() - timeStart;

    if ( fVerbose )
        Ses_ManPrintRuntime( pSes );

    /* cleanup */
    Ses_ManClean( pSes );

    return pGia;
}